

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_sse2.c
# Opt level: O2

void SharpYuvFilterRow_SSE2
               (int16_t *A,int16_t *B,int len,uint16_t *best_y,uint16_t *out,int bit_depth)

{
  short *psVar1;
  short *psVar2;
  uint16_t *puVar3;
  short *psVar4;
  short *psVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  long lVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint16_t uVar23;
  int iVar24;
  undefined1 auVar25 [16];
  short sVar26;
  short sVar31;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar39;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar38;
  undefined1 auVar30 [16];
  ushort uVar40;
  ushort uVar46;
  ushort uVar47;
  int iVar48;
  ushort uVar50;
  int iVar51;
  ushort uVar53;
  undefined1 in_XMM4 [16];
  ushort uVar49;
  ushort uVar52;
  ushort uVar54;
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  ushort uVar55;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  undefined1 in_XMM5 [16];
  ushort uVar65;
  undefined1 auVar56 [16];
  short sVar66;
  int iVar67;
  short sVar74;
  short sVar75;
  int iVar76;
  short sVar77;
  short sVar78;
  int iVar79;
  short sVar80;
  short sVar81;
  short sVar83;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  int iVar82;
  short sVar84;
  short sVar86;
  int iVar85;
  short sVar87;
  short sVar89;
  int iVar88;
  short sVar90;
  short sVar92;
  int iVar91;
  short sVar93;
  short sVar95;
  int iVar94;
  undefined2 uVar32;
  undefined1 auVar44 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  
  uVar22 = ~(-1 << ((byte)bit_depth & 0x1f));
  auVar25 = pshuflw(ZEXT416(uVar22),ZEXT416(uVar22),0);
  lVar16 = (long)len;
  lVar17 = 0;
  sVar10 = auVar25._2_2_;
  sVar11 = auVar25._0_2_;
  if (bit_depth < 0xb) {
    while (lVar17 + 8 <= lVar16) {
      psVar1 = A + lVar17;
      psVar4 = A + lVar17 + 1;
      psVar2 = B + lVar17;
      psVar5 = B + lVar17 + 1;
      sVar66 = *psVar5 + *psVar1;
      sVar74 = psVar5[1] + psVar1[1];
      sVar75 = psVar5[2] + psVar1[2];
      sVar77 = psVar5[3] + psVar1[3];
      sVar78 = psVar5[4] + psVar1[4];
      sVar80 = psVar5[5] + psVar1[5];
      sVar81 = psVar5[6] + psVar1[6];
      sVar83 = psVar5[7] + psVar1[7];
      sVar26 = *psVar2 + *psVar4;
      sVar31 = psVar2[1] + psVar4[1];
      sVar33 = psVar2[2] + psVar4[2];
      sVar34 = psVar2[3] + psVar4[3];
      sVar35 = psVar2[4] + psVar4[4];
      sVar36 = psVar2[5] + psVar4[5];
      sVar37 = psVar2[6] + psVar4[6];
      sVar39 = psVar2[7] + psVar4[7];
      sVar84 = sVar26 + sVar66 + 8;
      sVar86 = sVar31 + sVar74 + 8;
      sVar87 = sVar33 + sVar75 + 8;
      sVar89 = sVar34 + sVar77 + 8;
      sVar90 = sVar35 + sVar78 + 8;
      sVar92 = sVar36 + sVar80 + 8;
      sVar93 = sVar37 + sVar81 + 8;
      sVar95 = sVar39 + sVar83 + 8;
      auVar68._0_2_ = sVar66 * 2 + sVar84;
      auVar68._2_2_ = sVar74 * 2 + sVar86;
      auVar68._4_2_ = sVar75 * 2 + sVar87;
      auVar68._6_2_ = sVar77 * 2 + sVar89;
      auVar68._8_2_ = sVar78 * 2 + sVar90;
      auVar68._10_2_ = sVar80 * 2 + sVar92;
      auVar68._12_2_ = sVar81 * 2 + sVar93;
      auVar68._14_2_ = sVar83 * 2 + sVar95;
      auVar69 = psraw(auVar68,3);
      auVar27._0_2_ = sVar26 * 2 + sVar84;
      auVar27._2_2_ = sVar31 * 2 + sVar86;
      auVar27._4_2_ = sVar33 * 2 + sVar87;
      auVar27._6_2_ = sVar34 * 2 + sVar89;
      auVar27._8_2_ = sVar35 * 2 + sVar90;
      auVar27._10_2_ = sVar36 * 2 + sVar92;
      auVar27._12_2_ = sVar37 * 2 + sVar93;
      auVar27._14_2_ = sVar39 * 2 + sVar95;
      auVar25 = psraw(auVar27,3);
      auVar28._0_2_ = auVar25._0_2_ + *psVar1;
      auVar28._2_2_ = auVar25._2_2_ + psVar1[1];
      auVar28._4_2_ = auVar25._4_2_ + psVar1[2];
      auVar28._6_2_ = auVar25._6_2_ + psVar1[3];
      auVar28._8_2_ = auVar25._8_2_ + psVar1[4];
      auVar28._10_2_ = auVar25._10_2_ + psVar1[5];
      auVar28._12_2_ = auVar25._12_2_ + psVar1[6];
      auVar28._14_2_ = auVar25._14_2_ + psVar1[7];
      auVar70._0_2_ = auVar69._0_2_ + *psVar4;
      auVar70._2_2_ = auVar69._2_2_ + psVar4[1];
      auVar70._4_2_ = auVar69._4_2_ + psVar4[2];
      auVar70._6_2_ = auVar69._6_2_ + psVar4[3];
      auVar70._8_2_ = auVar69._8_2_ + psVar4[4];
      auVar70._10_2_ = auVar69._10_2_ + psVar4[5];
      auVar70._12_2_ = auVar69._12_2_ + psVar4[6];
      auVar70._14_2_ = auVar69._14_2_ + psVar4[7];
      auVar25 = psraw(auVar28,1);
      auVar69 = psraw(auVar70,1);
      puVar3 = best_y + lVar17 * 2;
      sVar66 = *puVar3 + auVar25._0_2_;
      sVar74 = puVar3[1] + auVar69._0_2_;
      sVar75 = puVar3[2] + auVar25._2_2_;
      sVar77 = puVar3[3] + auVar69._2_2_;
      sVar78 = puVar3[4] + auVar25._4_2_;
      sVar80 = puVar3[5] + auVar69._4_2_;
      sVar81 = puVar3[6] + auVar25._6_2_;
      sVar83 = puVar3[7] + auVar69._6_2_;
      puVar3 = best_y + lVar17 * 2 + 8;
      sVar26 = *puVar3 + auVar25._8_2_;
      sVar31 = puVar3[1] + auVar69._8_2_;
      sVar33 = puVar3[2] + auVar25._10_2_;
      sVar34 = puVar3[3] + auVar69._10_2_;
      sVar35 = puVar3[4] + auVar25._12_2_;
      sVar36 = puVar3[5] + auVar69._12_2_;
      sVar37 = puVar3[6] + auVar25._14_2_;
      sVar39 = puVar3[7] + auVar69._14_2_;
      uVar55 = (ushort)(sVar11 < sVar66) * sVar11 | (ushort)(sVar11 >= sVar66) * sVar66;
      uVar59 = (ushort)(sVar10 < sVar74) * sVar10 | (ushort)(sVar10 >= sVar74) * sVar74;
      uVar60 = (ushort)(sVar11 < sVar75) * sVar11 | (ushort)(sVar11 >= sVar75) * sVar75;
      uVar61 = (ushort)(sVar10 < sVar77) * sVar10 | (ushort)(sVar10 >= sVar77) * sVar77;
      uVar62 = (ushort)(sVar11 < sVar78) * sVar11 | (ushort)(sVar11 >= sVar78) * sVar78;
      uVar63 = (ushort)(sVar10 < sVar80) * sVar10 | (ushort)(sVar10 >= sVar80) * sVar80;
      uVar64 = (ushort)(sVar11 < sVar81) * sVar11 | (ushort)(sVar11 >= sVar81) * sVar81;
      uVar65 = (ushort)(sVar10 < sVar83) * sVar10 | (ushort)(sVar10 >= sVar83) * sVar83;
      uVar40 = (ushort)(sVar11 < sVar26) * sVar11 | (ushort)(sVar11 >= sVar26) * sVar26;
      uVar46 = (ushort)(sVar10 < sVar31) * sVar10 | (ushort)(sVar10 >= sVar31) * sVar31;
      uVar47 = (ushort)(sVar11 < sVar33) * sVar11 | (ushort)(sVar11 >= sVar33) * sVar33;
      uVar49 = (ushort)(sVar10 < sVar34) * sVar10 | (ushort)(sVar10 >= sVar34) * sVar34;
      uVar50 = (ushort)(sVar11 < sVar35) * sVar11 | (ushort)(sVar11 >= sVar35) * sVar35;
      uVar52 = (ushort)(sVar10 < sVar36) * sVar10 | (ushort)(sVar10 >= sVar36) * sVar36;
      uVar53 = (ushort)(sVar11 < sVar37) * sVar11 | (ushort)(sVar11 >= sVar37) * sVar37;
      uVar54 = (ushort)(sVar10 < sVar39) * sVar10 | (ushort)(sVar10 >= sVar39) * sVar39;
      puVar3 = out + lVar17 * 2;
      *puVar3 = (-1 < (short)uVar55) * uVar55;
      puVar3[1] = (-1 < (short)uVar59) * uVar59;
      puVar3[2] = (-1 < (short)uVar60) * uVar60;
      puVar3[3] = (-1 < (short)uVar61) * uVar61;
      puVar3[4] = (-1 < (short)uVar62) * uVar62;
      puVar3[5] = (-1 < (short)uVar63) * uVar63;
      puVar3[6] = (-1 < (short)uVar64) * uVar64;
      puVar3[7] = (-1 < (short)uVar65) * uVar65;
      puVar3 = out + lVar17 * 2 + 8;
      *puVar3 = (-1 < (short)uVar40) * uVar40;
      puVar3[1] = (-1 < (short)uVar46) * uVar46;
      puVar3[2] = (-1 < (short)uVar47) * uVar47;
      puVar3[3] = (-1 < (short)uVar49) * uVar49;
      puVar3[4] = (-1 < (short)uVar50) * uVar50;
      puVar3[5] = (-1 < (short)uVar52) * uVar52;
      puVar3[6] = (-1 < (short)uVar53) * uVar53;
      puVar3[7] = (-1 < (short)uVar54) * uVar54;
      lVar17 = lVar17 + 8;
    }
    for (; lVar17 < lVar16; lVar17 = lVar17 + 1) {
      iVar18 = (int)B[lVar17 + 1] + (int)A[lVar17];
      sVar10 = A[lVar17 + 1];
      iVar24 = (int)B[lVar17] + (int)sVar10;
      iVar20 = iVar18 + iVar24 + 8;
      uVar21 = (uint)best_y[lVar17 * 2] + (A[lVar17] * 8 + iVar24 * 2 + iVar20 >> 4);
      uVar19 = uVar22;
      if ((int)uVar21 < (int)uVar22) {
        uVar19 = uVar21;
      }
      uVar23 = (uint16_t)uVar19;
      if ((int)uVar21 < 0) {
        uVar23 = 0;
      }
      out[lVar17 * 2] = uVar23;
      uVar21 = (uint)best_y[lVar17 * 2 + 1] + (iVar18 * 2 + sVar10 * 8 + iVar20 >> 4);
      uVar19 = uVar21;
      if ((int)uVar22 <= (int)uVar21) {
        uVar19 = uVar22;
      }
      uVar23 = (uint16_t)uVar19;
      if ((int)uVar21 < 0) {
        uVar23 = 0;
      }
      out[lVar17 * 2 + 1] = uVar23;
    }
  }
  else {
    while (lVar17 + 4 <= lVar16) {
      uVar6 = *(undefined8 *)(A + lVar17);
      auVar43._0_12_ = in_XMM4._0_12_;
      auVar43._12_2_ = in_XMM4._6_2_;
      auVar43._14_2_ = (short)((ulong)uVar6 >> 0x30);
      auVar42._12_4_ = auVar43._12_4_;
      auVar42._0_10_ = in_XMM4._0_10_;
      auVar42._10_2_ = (short)((ulong)uVar6 >> 0x20);
      auVar41._10_6_ = auVar42._10_6_;
      auVar41._0_8_ = in_XMM4._0_8_;
      auVar41._8_2_ = in_XMM4._4_2_;
      auVar12._4_8_ = auVar41._8_8_;
      auVar12._2_2_ = (short)((ulong)uVar6 >> 0x10);
      auVar12._0_2_ = in_XMM4._2_2_;
      iVar48 = auVar12._0_4_ >> 0x10;
      iVar51 = auVar41._8_4_ >> 0x10;
      uVar7 = *(undefined8 *)(A + lVar17 + 1);
      auVar58._0_12_ = in_XMM5._0_12_;
      auVar58._12_2_ = in_XMM5._6_2_;
      auVar58._14_2_ = (short)((ulong)uVar7 >> 0x30);
      auVar57._12_4_ = auVar58._12_4_;
      auVar57._0_10_ = in_XMM5._0_10_;
      auVar57._10_2_ = (short)((ulong)uVar7 >> 0x20);
      auVar56._10_6_ = auVar57._10_6_;
      auVar56._0_8_ = in_XMM5._0_8_;
      auVar56._8_2_ = in_XMM5._4_2_;
      auVar13._4_8_ = auVar56._8_8_;
      auVar13._2_2_ = (short)((ulong)uVar7 >> 0x10);
      auVar13._0_2_ = in_XMM5._2_2_;
      in_XMM5._0_4_ = (int)(short)uVar7;
      in_XMM5._4_4_ = auVar13._0_4_ >> 0x10;
      in_XMM5._8_4_ = auVar56._8_4_ >> 0x10;
      in_XMM5._12_4_ = auVar57._12_4_ >> 0x10;
      uVar8 = *(ulong *)(B + lVar17);
      uVar32 = (undefined2)(uVar8 >> 0x30);
      auVar29._8_4_ = 0;
      auVar29._0_8_ = uVar8;
      auVar29._12_2_ = uVar32;
      auVar29._14_2_ = uVar32;
      uVar32 = (undefined2)(uVar8 >> 0x20);
      auVar69._12_4_ = auVar29._12_4_;
      auVar69._8_2_ = 0;
      auVar69._0_8_ = uVar8;
      auVar69._10_2_ = uVar32;
      auVar25._10_6_ = auVar69._10_6_;
      auVar25._8_2_ = uVar32;
      auVar25._0_8_ = uVar8;
      uVar32 = (undefined2)(uVar8 >> 0x10);
      auVar14._4_8_ = auVar25._8_8_;
      auVar14._2_2_ = uVar32;
      auVar14._0_2_ = uVar32;
      uVar9 = *(ulong *)(B + lVar17 + 1);
      uVar32 = (undefined2)(uVar9 >> 0x30);
      auVar73._8_4_ = 0;
      auVar73._0_8_ = uVar9;
      auVar73._12_2_ = uVar32;
      auVar73._14_2_ = uVar32;
      uVar32 = (undefined2)(uVar9 >> 0x20);
      auVar72._12_4_ = auVar73._12_4_;
      auVar72._8_2_ = 0;
      auVar72._0_8_ = uVar9;
      auVar72._10_2_ = uVar32;
      auVar71._10_6_ = auVar72._10_6_;
      auVar71._8_2_ = uVar32;
      auVar71._0_8_ = uVar9;
      uVar32 = (undefined2)(uVar9 >> 0x10);
      auVar15._4_8_ = auVar71._8_8_;
      auVar15._2_2_ = uVar32;
      auVar15._0_2_ = uVar32;
      iVar67 = (int)(short)uVar9 + (int)(short)uVar6;
      iVar76 = (auVar15._0_4_ >> 0x10) + iVar48;
      iVar79 = (auVar71._8_4_ >> 0x10) + iVar51;
      iVar82 = (auVar72._12_4_ >> 0x10) + (auVar42._12_4_ >> 0x10);
      iVar18 = (short)uVar8 + in_XMM5._0_4_;
      iVar20 = (auVar14._0_4_ >> 0x10) + in_XMM5._4_4_;
      iVar24 = (auVar25._8_4_ >> 0x10) + in_XMM5._8_4_;
      iVar38 = (auVar69._12_4_ >> 0x10) + in_XMM5._12_4_;
      iVar85 = iVar18 + iVar67 + 8;
      iVar88 = iVar20 + iVar76 + 8;
      iVar91 = iVar24 + iVar79 + 8;
      iVar94 = iVar38 + iVar82 + 8;
      iVar18 = (iVar18 * 2 + iVar85 >> 3) + (int)(short)uVar6 >> 1;
      iVar20 = (iVar20 * 2 + iVar88 >> 3) + iVar48 >> 1;
      auVar45._4_4_ = iVar20;
      auVar45._0_4_ = iVar18;
      auVar45._8_4_ = iVar20;
      auVar45._12_4_ = (iVar76 * 2 + iVar88 >> 3) + in_XMM5._4_4_ >> 1;
      auVar44._8_8_ = auVar45._8_8_;
      auVar44._4_4_ = (iVar67 * 2 + iVar85 >> 3) + in_XMM5._0_4_ >> 1;
      auVar44._0_4_ = iVar18;
      auVar30._4_4_ = (iVar79 * 2 + iVar91 >> 3) + in_XMM5._8_4_ >> 1;
      auVar30._0_4_ = (iVar24 * 2 + iVar91 >> 3) + iVar51 >> 1;
      auVar30._8_4_ = (iVar38 * 2 + iVar94 >> 3) + (auVar42._12_4_ >> 0x10) >> 1;
      auVar30._12_4_ = (iVar82 * 2 + iVar94 >> 3) + in_XMM5._12_4_ >> 1;
      in_XMM4 = packssdw(auVar44,auVar30);
      puVar3 = best_y + lVar17 * 2;
      sVar26 = *puVar3 + in_XMM4._0_2_;
      sVar31 = puVar3[1] + in_XMM4._2_2_;
      sVar33 = puVar3[2] + in_XMM4._4_2_;
      sVar34 = puVar3[3] + in_XMM4._6_2_;
      sVar35 = puVar3[4] + in_XMM4._8_2_;
      sVar36 = puVar3[5] + in_XMM4._10_2_;
      sVar37 = puVar3[6] + in_XMM4._12_2_;
      sVar39 = puVar3[7] + in_XMM4._14_2_;
      uVar40 = (ushort)(sVar11 < sVar26) * sVar11 | (ushort)(sVar11 >= sVar26) * sVar26;
      uVar46 = (ushort)(sVar10 < sVar31) * sVar10 | (ushort)(sVar10 >= sVar31) * sVar31;
      uVar47 = (ushort)(sVar11 < sVar33) * sVar11 | (ushort)(sVar11 >= sVar33) * sVar33;
      uVar49 = (ushort)(sVar10 < sVar34) * sVar10 | (ushort)(sVar10 >= sVar34) * sVar34;
      uVar50 = (ushort)(sVar11 < sVar35) * sVar11 | (ushort)(sVar11 >= sVar35) * sVar35;
      uVar52 = (ushort)(sVar10 < sVar36) * sVar10 | (ushort)(sVar10 >= sVar36) * sVar36;
      uVar53 = (ushort)(sVar11 < sVar37) * sVar11 | (ushort)(sVar11 >= sVar37) * sVar37;
      uVar54 = (ushort)(sVar10 < sVar39) * sVar10 | (ushort)(sVar10 >= sVar39) * sVar39;
      puVar3 = out + lVar17 * 2;
      *puVar3 = (-1 < (short)uVar40) * uVar40;
      puVar3[1] = (-1 < (short)uVar46) * uVar46;
      puVar3[2] = (-1 < (short)uVar47) * uVar47;
      puVar3[3] = (-1 < (short)uVar49) * uVar49;
      puVar3[4] = (-1 < (short)uVar50) * uVar50;
      puVar3[5] = (-1 < (short)uVar52) * uVar52;
      puVar3[6] = (-1 < (short)uVar53) * uVar53;
      puVar3[7] = (-1 < (short)uVar54) * uVar54;
      lVar17 = lVar17 + 4;
    }
    for (; lVar17 < lVar16; lVar17 = lVar17 + 1) {
      iVar18 = (int)B[lVar17 + 1] + (int)A[lVar17];
      sVar10 = A[lVar17 + 1];
      iVar24 = (int)B[lVar17] + (int)sVar10;
      iVar20 = iVar18 + iVar24 + 8;
      uVar21 = (uint)best_y[lVar17 * 2] + (A[lVar17] * 8 + iVar24 * 2 + iVar20 >> 4);
      uVar19 = uVar22;
      if ((int)uVar21 < (int)uVar22) {
        uVar19 = uVar21;
      }
      uVar23 = (uint16_t)uVar19;
      if ((int)uVar21 < 0) {
        uVar23 = 0;
      }
      out[lVar17 * 2] = uVar23;
      uVar21 = (uint)best_y[lVar17 * 2 + 1] + (iVar18 * 2 + sVar10 * 8 + iVar20 >> 4);
      uVar19 = uVar21;
      if ((int)uVar22 <= (int)uVar21) {
        uVar19 = uVar22;
      }
      uVar23 = (uint16_t)uVar19;
      if ((int)uVar21 < 0) {
        uVar23 = 0;
      }
      out[lVar17 * 2 + 1] = uVar23;
    }
  }
  return;
}

Assistant:

static void SharpYuvFilterRow_SSE2(const int16_t* A, const int16_t* B, int len,
                                   const uint16_t* best_y, uint16_t* out,
                                   int bit_depth) {
  if (bit_depth <= 10) {
    SharpYuvFilterRow16_SSE2(A, B, len, best_y, out, bit_depth);
  } else {
    SharpYuvFilterRow32_SSE2(A, B, len, best_y, out, bit_depth);
  }
}